

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

void __thiscall
llbuild::core::BuildEngine::addCancellationDelegate(BuildEngine *this,CancellationDelegate *del)

{
  void *pvVar1;
  CancellationDelegate *local_30;
  pair<llvm::detail::DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>::Iterator,_bool>
  local_28;
  
  pvVar1 = this->impl;
  local_30 = del;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)((long)pvVar1 + 0x90))->__data);
  if ((*(byte *)((long)pvVar1 + 200) & 1) == 0) {
    llvm::detail::
    DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
    ::insert(&local_28,
             (DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
              *)((long)pvVar1 + 0xf8),&local_30);
  }
  else {
    (*local_30->_vptr_CancellationDelegate[2])();
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x90));
  return;
}

Assistant:

void BuildEngine::addCancellationDelegate(CancellationDelegate* del) {
  static_cast<BuildEngineImpl*>(impl)->addCancellationDelegate(std::move(del));
}